

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O2

void __thiscall ear::PolarExtent::~PolarExtent(PolarExtent *this)

{
  free((this->ctx).xs);
  free((this->ctx).ys);
  free((this->ctx).zs);
  free((this->ctx).panning_results);
  free((this->ctx).summed_panning_results);
  free((this->ctx).results);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->pvsMax);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->pvsMin);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>::~unique_ptr
            (&this->core_impl);
  return;
}

Assistant:

PolarExtent::~PolarExtent() {
    xsimd::aligned_free(ctx.xs);
    xsimd::aligned_free(ctx.ys);
    xsimd::aligned_free(ctx.zs);
    xsimd::aligned_free(ctx.panning_results);
    xsimd::aligned_free(ctx.summed_panning_results);
    xsimd::aligned_free(ctx.results);
  }